

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceBuffer * __thiscall
slang::SourceManager::readHeader
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view path,
          SourceLocation includedFrom,bool isSystemPath)

{
  pointer ppVar1;
  char cVar2;
  FileInfo *pFVar3;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *__range2;
  pointer ppVar4;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> userDirs;
  path p;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> local_98;
  path local_80;
  path local_58;
  
  local_80._M_pathname._M_string_length = (size_type)path._M_str;
  local_80._M_pathname._M_dataplus._M_p = (pointer)path._M_len;
  if (local_80._M_pathname._M_dataplus._M_p == (pointer)0x0) {
    assert::assertFailed
              ("!path.empty()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
               ,0x150,
               "SourceBuffer slang::SourceManager::readHeader(string_view, SourceLocation, bool)");
  }
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_58,(basic_string_view<char,_std::char_traits<char>_> *)&local_80,auto_format);
  cVar2 = std::filesystem::__cxx11::path::has_root_directory();
  if (cVar2 == '\0') {
    if (isSystemPath) {
      local_98.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
      local_98.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
      local_98.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      operator=(&local_98,&this->systemDirectories);
      pthread_rwlock_unlock((pthread_rwlock_t *)this);
      ppVar1 = local_98.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_98.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar4 = local_98.
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::filesystem::__cxx11::operator/(&local_80,ppVar4,&local_58);
          openCached(__return_storage_ptr__,this,&local_80,includedFrom);
          std::filesystem::__cxx11::path::~path(&local_80);
          if ((__return_storage_ptr__->id).id != 0) goto LAB_001a9838;
          ppVar4 = ppVar4 + 1;
        } while (ppVar4 != ppVar1);
      }
    }
    else {
      pFVar3 = getFileInfo(this,(BufferID)(includedFrom._0_4_ & 0xfffffff));
      if (((pFVar3 != (FileInfo *)0x0) && (pFVar3->data != (FileData *)0x0)) &&
         (pFVar3->data->directory != (path *)0x0)) {
        std::filesystem::__cxx11::operator/(&local_80,pFVar3->data->directory,&local_58);
        openCached(__return_storage_ptr__,this,&local_80,includedFrom);
        std::filesystem::__cxx11::path::~path(&local_80);
        if ((__return_storage_ptr__->id).id != 0) goto LAB_001a9840;
      }
      local_98.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_start = (path *)0x0;
      local_98.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_finish = (path *)0x0;
      local_98.
      super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      operator=(&local_98,&this->userDirectories);
      pthread_rwlock_unlock((pthread_rwlock_t *)this);
      ppVar1 = local_98.
               super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_98.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar4 = local_98.
                 super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::filesystem::__cxx11::operator/(&local_80,ppVar4,&local_58);
          openCached(__return_storage_ptr__,this,&local_80,includedFrom);
          std::filesystem::__cxx11::path::~path(&local_80);
          if ((__return_storage_ptr__->id).id != 0) goto LAB_001a9838;
          ppVar4 = ppVar4 + 1;
        } while (ppVar4 != ppVar1);
      }
    }
    (__return_storage_ptr__->data)._M_len = 0;
    (__return_storage_ptr__->data)._M_str = (char *)0x0;
    *(undefined8 *)&__return_storage_ptr__->id = 0;
LAB_001a9838:
    std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
    ~vector(&local_98);
  }
  else {
    openCached(__return_storage_ptr__,this,&local_58,includedFrom);
  }
LAB_001a9840:
  std::filesystem::__cxx11::path::~path(&local_58);
  return __return_storage_ptr__;
}

Assistant:

SourceRange SourceManager::getExpansionRange(SourceLocation location) const {
    auto buffer = location.buffer();
    if (!buffer)
        return SourceRange();

    std::shared_lock lock(mut);

    ASSERT(buffer.getId() < bufferEntries.size());
    const ExpansionInfo& info = std::get<ExpansionInfo>(bufferEntries[buffer.getId()]);
    return info.expansionRange;
}